

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O2

void __thiscall QAbstractSlider::changeEvent(QAbstractSlider *this,QEvent *ev)

{
  if ((*(short *)(ev + 8) == 0x62) && ((((this->super_QWidget).data)->widget_attributes & 1) != 0))
  {
    QBasicTimer::stop();
    setSliderDown(this,false);
  }
  QWidget::changeEvent(&this->super_QWidget,ev);
  return;
}

Assistant:

void QAbstractSlider::changeEvent(QEvent *ev)
{
    Q_D(QAbstractSlider);
    switch (ev->type()) {
    case QEvent::EnabledChange:
        if (!isEnabled()) {
            d->repeatActionTimer.stop();
            setSliderDown(false);
        }
        Q_FALLTHROUGH();
    default:
        QWidget::changeEvent(ev);
    }
}